

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerResults.cpp
# Opt level: O2

void __thiscall
HdlcAnalyzerResults::GenControlFieldString
          (HdlcAnalyzerResults *this,Frame *frame,DisplayBase display_base,bool tabular)

{
  HdlcFrameType HVar1;
  ostream *poVar2;
  HdlcAnalyzerResults *this_00;
  char *pcVar3;
  allocator local_279;
  char *local_278 [4];
  string escStr;
  char ctlNumStr [64];
  char byteStr [64];
  stringstream ss;
  ostream local_1a0 [8];
  string local_198 [368];
  
  AnalyzerHelpers::GetNumberString(*(ulonglong *)(frame + 0x10),display_base,8,byteStr,0x40);
  this_00 = (HdlcAnalyzerResults *)0x1;
  AnalyzerHelpers::GetNumberString(*(ulonglong *)(frame + 0x18),Decimal,8,ctlNumStr,0x40);
  GenEscapedString_abi_cxx11_(&escStr,this_00,frame);
  if (*(long *)(frame + 0x18) == 0) {
    HVar1 = HdlcAnalyzer::GetFrameType((U8)frame[0x10]);
    if (HVar1 < 4) {
      pcVar3 = (&PTR_anon_var_dwarf_c4dc_00114d48)[HVar1];
    }
    else {
      pcVar3 = (char *)0x0;
    }
  }
  else {
    pcVar3 = "";
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_1a0,"CTL");
  poVar2 = std::operator<<(poVar2,ctlNumStr);
  std::operator<<(poVar2," [");
  if (tabular) {
    std::__cxx11::string::string((string *)local_278,"",&local_279);
    std::__cxx11::stringbuf::str(local_198);
    std::__cxx11::string::~string((string *)local_278);
    poVar2 = std::operator<<(local_1a0,"Control");
    poVar2 = std::operator<<(poVar2,ctlNumStr);
    std::operator<<(poVar2," [");
    std::__cxx11::stringbuf::str();
    AnalyzerResults::AddTabularText
              ((char *)this,local_278[0],byteStr,"]",pcVar3,escStr._M_dataplus._M_p);
  }
  else {
    AnalyzerResults::AddResultString((char *)this,"C",ctlNumStr,(char *)0x0,(char *)0x0,(char *)0x0)
    ;
    AnalyzerResults::AddResultString
              ((char *)this,"CTL",ctlNumStr,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::stringbuf::str();
    AnalyzerResults::AddResultString
              ((char *)this,local_278[0],byteStr,"]",escStr._M_dataplus._M_p,(char *)0x0);
    std::__cxx11::string::~string((string *)local_278);
    std::__cxx11::stringbuf::str();
    AnalyzerResults::AddResultString
              ((char *)this,local_278[0],byteStr,"]",pcVar3,escStr._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)local_278);
    std::__cxx11::string::string((string *)local_278,"",&local_279);
    std::__cxx11::stringbuf::str(local_198);
    std::__cxx11::string::~string((string *)local_278);
    poVar2 = std::operator<<(local_1a0,"Control");
    poVar2 = std::operator<<(poVar2,ctlNumStr);
    std::operator<<(poVar2," [");
    std::__cxx11::stringbuf::str();
    AnalyzerResults::AddResultString
              ((char *)this,local_278[0],byteStr,"]",pcVar3,escStr._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)local_278);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::__cxx11::string::~string((string *)&escStr);
  return;
}

Assistant:

void HdlcAnalyzerResults::GenControlFieldString( const Frame& frame, DisplayBase display_base, bool tabular )
{
    char byteStr[ 64 ];
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, byteStr, 64 );

    char ctlNumStr[ 64 ];
    AnalyzerHelpers::GetNumberString( frame.mData2, Decimal, 8, ctlNumStr, 64 );

    string escStr = GenEscapedString( frame );

    char* frameTypeStr = 0;
    if( frame.mData2 != 0 )
    {
        frameTypeStr = "";
    }
    else
    {
        switch( HdlcAnalyzer::GetFrameType( frame.mData1 ) )
        {
        case HDLC_I_FRAME:
            frameTypeStr = " - I-Frame";
            break;
        case HDLC_S_FRAME:
            frameTypeStr = " - S-Frame";
            break;
        case HDLC_U_FRAME:
            frameTypeStr = " - U-Frame";
            break;
        }
    }

    stringstream ss;
    ss << "CTL" << ctlNumStr << " [";

    if( !tabular )
    {
        AddResultString( "C", ctlNumStr );
        AddResultString( "CTL", ctlNumStr );
        AddResultString( ss.str().c_str(), byteStr, "]", escStr.c_str() );
        AddResultString( ss.str().c_str(), byteStr, "]", frameTypeStr, escStr.c_str() );
        ss.str( "" );
        ss << "Control" << ctlNumStr << " [";

        AddResultString( ss.str().c_str(), byteStr, "]", frameTypeStr, escStr.c_str() );
    }
    else
    {
        ss.str( "" );
        ss << "Control" << ctlNumStr << " [";
        AddTabularText( ss.str().c_str(), byteStr, "]", frameTypeStr, escStr.c_str() );
    }
}